

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O2

void uavs3d_if_ver_chroma_w128_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  undefined2 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  bool bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  iVar7 = i_src * 2;
  iVar6 = i_src * 3;
  uVar1 = *(undefined2 *)coeff;
  auVar12._2_2_ = uVar1;
  auVar12._0_2_ = uVar1;
  auVar12._4_2_ = uVar1;
  auVar12._6_2_ = uVar1;
  auVar12._8_2_ = uVar1;
  auVar12._10_2_ = uVar1;
  auVar12._12_2_ = uVar1;
  auVar12._14_2_ = uVar1;
  auVar12._16_2_ = uVar1;
  auVar12._18_2_ = uVar1;
  auVar12._20_2_ = uVar1;
  auVar12._22_2_ = uVar1;
  auVar12._24_2_ = uVar1;
  auVar12._26_2_ = uVar1;
  auVar12._28_2_ = uVar1;
  auVar12._30_2_ = uVar1;
  uVar1 = *(undefined2 *)(coeff + 2);
  auVar13._2_2_ = uVar1;
  auVar13._0_2_ = uVar1;
  auVar13._4_2_ = uVar1;
  auVar13._6_2_ = uVar1;
  auVar13._8_2_ = uVar1;
  auVar13._10_2_ = uVar1;
  auVar13._12_2_ = uVar1;
  auVar13._14_2_ = uVar1;
  auVar13._16_2_ = uVar1;
  auVar13._18_2_ = uVar1;
  auVar13._20_2_ = uVar1;
  auVar13._22_2_ = uVar1;
  auVar13._24_2_ = uVar1;
  auVar13._26_2_ = uVar1;
  auVar13._28_2_ = uVar1;
  auVar13._30_2_ = uVar1;
  lVar8 = (long)i_src;
  pauVar9 = (undefined1 (*) [32])(dst + 0x60);
  pauVar10 = (undefined1 (*) [32])(src + (0x60 - lVar8));
  auVar14._8_2_ = 0x20;
  auVar14._0_8_ = 0x20002000200020;
  auVar14._10_2_ = 0x20;
  auVar14._12_2_ = 0x20;
  auVar14._14_2_ = 0x20;
  auVar14._16_2_ = 0x20;
  auVar14._18_2_ = 0x20;
  auVar14._20_2_ = 0x20;
  auVar14._22_2_ = 0x20;
  auVar14._24_2_ = 0x20;
  auVar14._26_2_ = 0x20;
  auVar14._28_2_ = 0x20;
  auVar14._30_2_ = 0x20;
  while (bVar11 = height != 0, height = height + -1, bVar11) {
    auVar15 = vpunpcklbw_avx2(pauVar10[-3],*(undefined1 (*) [32])src);
    auVar16 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar10[-3] + iVar7),
                              *(undefined1 (*) [32])(pauVar10[-3] + iVar6));
    auVar17 = vpunpckhbw_avx2(pauVar10[-3],*(undefined1 (*) [32])src);
    auVar2 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar10[-3] + iVar7),
                             *(undefined1 (*) [32])(pauVar10[-3] + iVar6));
    auVar4 = vpunpcklbw_avx2(pauVar10[-2],*(undefined1 (*) [32])((long)src + 0x20));
    auVar5 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar10[-2] + iVar7),
                             *(undefined1 (*) [32])(pauVar10[-2] + iVar6));
    auVar18 = vpunpckhbw_avx2(pauVar10[-2],*(undefined1 (*) [32])((long)src + 0x20));
    auVar3 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar10[-2] + iVar7),
                             *(undefined1 (*) [32])(pauVar10[-2] + iVar6));
    auVar15 = vpmaddubsw_avx2(auVar15,auVar12);
    auVar16 = vpmaddubsw_avx2(auVar16,auVar13);
    auVar15 = vpaddw_avx2(auVar15,auVar16);
    auVar16 = vpmaddubsw_avx2(auVar17,auVar12);
    auVar17 = vpmaddubsw_avx2(auVar2,auVar13);
    auVar16 = vpaddw_avx2(auVar16,auVar17);
    auVar17 = vpmaddubsw_avx2(auVar4,auVar12);
    auVar2 = vpmaddubsw_avx2(auVar5,auVar13);
    auVar17 = vpaddw_avx2(auVar17,auVar2);
    auVar2 = vpmaddubsw_avx2(auVar18,auVar12);
    auVar18 = vpmaddubsw_avx2(auVar3,auVar13);
    auVar2 = vpaddw_avx2(auVar2,auVar18);
    auVar15 = vpaddw_avx2(auVar15,auVar14);
    auVar16 = vpaddw_avx2(auVar16,auVar14);
    auVar17 = vpaddw_avx2(auVar17,auVar14);
    auVar2 = vpaddw_avx2(auVar2,auVar14);
    auVar18 = vpsraw_avx2(auVar15,6);
    auVar15 = vpsraw_avx2(auVar16,6);
    auVar15 = vpackuswb_avx2(auVar18,auVar15);
    auVar17 = vpsraw_avx2(auVar17,6);
    auVar16 = vpsraw_avx2(auVar2,6);
    auVar16 = vpackuswb_avx2(auVar17,auVar16);
    pauVar9[-3] = auVar15;
    pauVar9[-2] = auVar16;
    auVar15 = vpunpcklbw_avx2(pauVar10[-1],*(undefined1 (*) [32])((long)src + 0x40));
    auVar16 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar10[-1] + iVar7),
                              *(undefined1 (*) [32])(pauVar10[-1] + iVar6));
    auVar17 = vpunpckhbw_avx2(pauVar10[-1],*(undefined1 (*) [32])((long)src + 0x40));
    auVar2 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar10[-1] + iVar7),
                             *(undefined1 (*) [32])(pauVar10[-1] + iVar6));
    auVar4 = vpunpcklbw_avx2(*pauVar10,*(undefined1 (*) [32])((long)src + 0x60));
    auVar5 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar10 + iVar7),
                             *(undefined1 (*) [32])(*pauVar10 + iVar6));
    auVar18 = vpunpckhbw_avx2(*pauVar10,*(undefined1 (*) [32])((long)src + 0x60));
    auVar3 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar10 + iVar7),
                             *(undefined1 (*) [32])(*pauVar10 + iVar6));
    auVar15 = vpmaddubsw_avx2(auVar15,auVar12);
    auVar16 = vpmaddubsw_avx2(auVar16,auVar13);
    auVar15 = vpaddw_avx2(auVar15,auVar16);
    auVar16 = vpmaddubsw_avx2(auVar17,auVar12);
    auVar17 = vpmaddubsw_avx2(auVar2,auVar13);
    auVar16 = vpaddw_avx2(auVar16,auVar17);
    auVar17 = vpmaddubsw_avx2(auVar4,auVar12);
    auVar2 = vpmaddubsw_avx2(auVar5,auVar13);
    auVar17 = vpaddw_avx2(auVar17,auVar2);
    auVar2 = vpmaddubsw_avx2(auVar18,auVar12);
    auVar18 = vpmaddubsw_avx2(auVar3,auVar13);
    auVar2 = vpaddw_avx2(auVar2,auVar18);
    auVar15 = vpaddw_avx2(auVar15,auVar14);
    auVar16 = vpaddw_avx2(auVar16,auVar14);
    auVar17 = vpaddw_avx2(auVar17,auVar14);
    auVar2 = vpaddw_avx2(auVar2,auVar14);
    auVar18 = vpsraw_avx2(auVar15,6);
    auVar15 = vpsraw_avx2(auVar16,6);
    auVar15 = vpackuswb_avx2(auVar18,auVar15);
    auVar17 = vpsraw_avx2(auVar17,6);
    auVar16 = vpsraw_avx2(auVar2,6);
    auVar16 = vpackuswb_avx2(auVar17,auVar16);
    pauVar9[-1] = auVar15;
    *pauVar9 = auVar16;
    pauVar9 = (undefined1 (*) [32])(*pauVar9 + i_dst);
    pauVar10 = (undefined1 (*) [32])(*pauVar10 + lVar8);
    src = *(undefined1 (*) [32])src + lVar8;
  }
  return;
}

Assistant:

void uavs3d_if_ver_chroma_w128_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    const int i_src2 = i_src * 2;
    const int i_src3 = i_src * 3;
    __m256i coeff0 = _mm256_set1_epi16(*(s16*)coeff);
    __m256i coeff1 = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i S0, S1, S2, S3, S4, S5, S6, S7;
    __m256i T0, T1, T2, T3, T4, T5, T6, T7, mVal0, mVal1, mVal2, mVal3;

    src -= i_src;

    while (height--) {
        S0 = _mm256_loadu_si256((__m256i*)(src));
        S4 = _mm256_loadu_si256((__m256i*)(src + 32));
        S1 = _mm256_loadu_si256((__m256i*)(src + i_src));
        S5 = _mm256_loadu_si256((__m256i*)(src + i_src + 32));
        S2 = _mm256_loadu_si256((__m256i*)(src + i_src2));
        S6 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 32));
        S3 = _mm256_loadu_si256((__m256i*)(src + i_src3));
        S7 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 32));

        T0 = _mm256_unpacklo_epi8(S0, S1);
        T1 = _mm256_unpacklo_epi8(S2, S3);
        T2 = _mm256_unpackhi_epi8(S0, S1);
        T3 = _mm256_unpackhi_epi8(S2, S3);
        T4 = _mm256_unpacklo_epi8(S4, S5);
        T5 = _mm256_unpacklo_epi8(S6, S7);
        T6 = _mm256_unpackhi_epi8(S4, S5);
        T7 = _mm256_unpackhi_epi8(S6, S7);

        T0 = _mm256_maddubs_epi16(T0, coeff0);
        T1 = _mm256_maddubs_epi16(T1, coeff1);
        T2 = _mm256_maddubs_epi16(T2, coeff0);
        T3 = _mm256_maddubs_epi16(T3, coeff1);
        T4 = _mm256_maddubs_epi16(T4, coeff0);
        T5 = _mm256_maddubs_epi16(T5, coeff1);
        T6 = _mm256_maddubs_epi16(T6, coeff0);
        T7 = _mm256_maddubs_epi16(T7, coeff1);

        mVal0 = _mm256_add_epi16(T0, T1);
        mVal1 = _mm256_add_epi16(T2, T3);
        mVal2 = _mm256_add_epi16(T4, T5);
        mVal3 = _mm256_add_epi16(T6, T7);

        mVal0 = _mm256_add_epi16(mVal0, mAddOffset);
        mVal1 = _mm256_add_epi16(mVal1, mAddOffset);
        mVal2 = _mm256_add_epi16(mVal2, mAddOffset);
        mVal3 = _mm256_add_epi16(mVal3, mAddOffset);
        mVal0 = _mm256_srai_epi16(mVal0, shift);
        mVal1 = _mm256_srai_epi16(mVal1, shift);
        mVal2 = _mm256_srai_epi16(mVal2, shift);
        mVal3 = _mm256_srai_epi16(mVal3, shift);
        mVal0 = _mm256_packus_epi16(mVal0, mVal1);
        mVal1 = _mm256_packus_epi16(mVal2, mVal3);

        _mm256_storeu_si256((__m256i*)(dst), mVal0);
        _mm256_storeu_si256((__m256i*)(dst + 32), mVal1);

        S0 = _mm256_loadu_si256((__m256i*)(src + 64));
        S4 = _mm256_loadu_si256((__m256i*)(src + 96));
        S1 = _mm256_loadu_si256((__m256i*)(src + i_src + 64));
        S5 = _mm256_loadu_si256((__m256i*)(src + i_src + 96));
        S2 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 64));
        S6 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 96));
        S3 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 64));
        S7 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 96));

        src += i_src;
        uavs3d_prefetch(src + i_src3, _MM_HINT_NTA);

        T0 = _mm256_unpacklo_epi8(S0, S1);
        T1 = _mm256_unpacklo_epi8(S2, S3);
        T2 = _mm256_unpackhi_epi8(S0, S1);
        T3 = _mm256_unpackhi_epi8(S2, S3);
        T4 = _mm256_unpacklo_epi8(S4, S5);
        T5 = _mm256_unpacklo_epi8(S6, S7);
        T6 = _mm256_unpackhi_epi8(S4, S5);
        T7 = _mm256_unpackhi_epi8(S6, S7);

        T0 = _mm256_maddubs_epi16(T0, coeff0);
        T1 = _mm256_maddubs_epi16(T1, coeff1);
        T2 = _mm256_maddubs_epi16(T2, coeff0);
        T3 = _mm256_maddubs_epi16(T3, coeff1);
        T4 = _mm256_maddubs_epi16(T4, coeff0);
        T5 = _mm256_maddubs_epi16(T5, coeff1);
        T6 = _mm256_maddubs_epi16(T6, coeff0);
        T7 = _mm256_maddubs_epi16(T7, coeff1);

        mVal0 = _mm256_add_epi16(T0, T1);
        mVal1 = _mm256_add_epi16(T2, T3);
        mVal2 = _mm256_add_epi16(T4, T5);
        mVal3 = _mm256_add_epi16(T6, T7);

        mVal0 = _mm256_add_epi16(mVal0, mAddOffset);
        mVal1 = _mm256_add_epi16(mVal1, mAddOffset);
        mVal2 = _mm256_add_epi16(mVal2, mAddOffset);
        mVal3 = _mm256_add_epi16(mVal3, mAddOffset);
        mVal0 = _mm256_srai_epi16(mVal0, shift);
        mVal1 = _mm256_srai_epi16(mVal1, shift);
        mVal2 = _mm256_srai_epi16(mVal2, shift);
        mVal3 = _mm256_srai_epi16(mVal3, shift);
        mVal0 = _mm256_packus_epi16(mVal0, mVal1);
        mVal1 = _mm256_packus_epi16(mVal2, mVal3);

        _mm256_storeu_si256((__m256i*)(dst + 64), mVal0);
        _mm256_storeu_si256((__m256i*)(dst + 96), mVal1);

        dst += i_dst;
    }
}